

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v11::detail::dragonbox::shorter_interval_case<float>(int exponent)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  byte bVar4;
  uint uVar5;
  char cVar6;
  decimal_fp<float> ret_value;
  
  iVar1 = floor_log10_pow2_minus_log10_4_over_3(exponent);
  iVar2 = floor_log2_pow10(-iVar1);
  cVar6 = (char)iVar2 + (char)exponent;
  uVar3 = cache_accessor<float>::get_cached_power(-iVar1);
  bVar4 = 0x28 - cVar6;
  uVar5 = (uint)((exponent & 0xfffffffeU) != 2) + (int)(uVar3 - (uVar3 >> 0x19) >> (bVar4 & 0x3f));
  ret_value.significand =
       (significand_type)(((uVar3 >> 0x18) + uVar3 >> (bVar4 & 0x3f) & 0xffffffff) / 10);
  if (ret_value.significand * 10 < uVar5) {
    ret_value.significand = (int)(uVar3 >> (0x27U - cVar6 & 0x3f)) + 1U >> 1;
    ret_value.exponent = iVar1;
    if (exponent == -0x23) {
      ret_value.significand = ret_value.significand & 0xfffffffe;
    }
    else {
      if (uVar5 <= ret_value.significand) {
        return ret_value;
      }
      ret_value.significand = ret_value.significand + 1;
    }
  }
  else {
    ret_value.exponent = iVar1 + 1;
    iVar1 = remove_trailing_zeros(&ret_value.significand,0);
    ret_value.exponent = ret_value.exponent + iVar1;
  }
  return ret_value;
}

Assistant:

FMT_INLINE decimal_fp<T> shorter_interval_case(int exponent) noexcept {
  decimal_fp<T> ret_value;
  // Compute k and beta
  const int minus_k = floor_log10_pow2_minus_log10_4_over_3(exponent);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute xi and zi
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);

  auto xi = cache_accessor<T>::compute_left_endpoint_for_shorter_interval_case(
      cache, beta);
  auto zi = cache_accessor<T>::compute_right_endpoint_for_shorter_interval_case(
      cache, beta);

  // If the left endpoint is not an integer, increase it
  if (!is_left_endpoint_integer_shorter_interval<T>(exponent)) ++xi;

  // Try bigger divisor
  ret_value.significand = zi / 10;

  // If succeed, remove trailing zeros if necessary and return
  if (ret_value.significand * 10 >= xi) {
    ret_value.exponent = minus_k + 1;
    ret_value.exponent += remove_trailing_zeros(ret_value.significand);
    return ret_value;
  }

  // Otherwise, compute the round-up of y
  ret_value.significand =
      cache_accessor<T>::compute_round_up_for_shorter_interval_case(cache,
                                                                    beta);
  ret_value.exponent = minus_k;

  // When tie occurs, choose one of them according to the rule
  if (exponent >= float_info<T>::shorter_interval_tie_lower_threshold &&
      exponent <= float_info<T>::shorter_interval_tie_upper_threshold) {
    ret_value.significand = ret_value.significand % 2 == 0
                                ? ret_value.significand
                                : ret_value.significand - 1;
  } else if (ret_value.significand < xi) {
    ++ret_value.significand;
  }
  return ret_value;
}